

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_dec.c
# Opt level: O2

void jpc_dec_destroy(jpc_dec_t *dec)

{
  int tileno;
  int iVar1;
  jpc_dec_tile_t *tile;
  jpc_dec_tile_t *tile_00;
  
  if (dec->cstate != (jpc_cstate_t *)0x0) {
    jpc_cstate_destroy(dec->cstate);
  }
  if (dec->pkthdrstreams != (jpc_streamlist_t *)0x0) {
    jpc_streamlist_destroy(dec->pkthdrstreams);
  }
  if (dec->ppmstab != (jpc_ppxstab_t *)0x0) {
    jpc_ppxstab_destroy(dec->ppmstab);
  }
  if (dec->image != (jas_image_t *)0x0) {
    jas_image_destroy(dec->image);
  }
  if (dec->cp != (jpc_dec_cp_t *)0x0) {
    jpc_dec_cp_destroy(dec->cp);
  }
  if (dec->cmpts != (jpc_dec_cmpt_t *)0x0) {
    jas_free(dec->cmpts);
  }
  tile_00 = dec->tiles;
  if (tile_00 != (jpc_dec_tile_t *)0x0) {
    for (iVar1 = 0; iVar1 < dec->numtiles; iVar1 = iVar1 + 1) {
      if (tile_00->state != 3) {
        jpc_dec_tilefini(dec,tile_00);
      }
      tile_00 = tile_00 + 1;
    }
    jas_free(dec->tiles);
  }
  jas_free(dec);
  return;
}

Assistant:

static void jpc_dec_destroy(jpc_dec_t *dec)
{
	if (dec->cstate) {
		jpc_cstate_destroy(dec->cstate);
	}
	if (dec->pkthdrstreams) {
		jpc_streamlist_destroy(dec->pkthdrstreams);
	}
	if (dec->ppmstab) {
		jpc_ppxstab_destroy(dec->ppmstab);
	}
	if (dec->image) {
		jas_image_destroy(dec->image);
	}

	if (dec->cp) {
		jpc_dec_cp_destroy(dec->cp);
	}

	if (dec->cmpts) {
		jas_free(dec->cmpts);
	}

	if (dec->tiles) {
		int tileno;
		jpc_dec_tile_t *tile;

		for (tileno = 0, tile = dec->tiles; tileno < dec->numtiles; ++tileno,
		  ++tile) {
			if (tile->state != JPC_TILE_DONE) {
				jpc_dec_tilefini(dec, tile);
			}
		}

		jas_free(dec->tiles);
	}

	jas_free(dec);
}